

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void lower_bound_sorted_suite::find_odd_first_predicate(void)

{
  array<int,_5UL> storage;
  undefined4 local_64;
  int *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined1 local_44 [12];
  undefined4 *local_38;
  
  local_58 = 0x37;
  uStack_54 = 0x2c;
  uStack_50 = 0x21;
  uStack_4c = 0x16;
  local_48 = 0xb;
  local_64 = 0x38;
  local_60 = vista::lower_bound_sorted<int*,int,std::greater<int>>(&local_58,local_44,&local_64);
  local_38 = &local_58;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 56, std::greater<int>{})",
             "storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x409,"void lower_bound_sorted_suite::find_odd_first_predicate()",&local_60,&local_38)
  ;
  local_64 = 0x37;
  local_60 = vista::lower_bound_sorted<int*,int,std::greater<int>>(&local_58,local_44,&local_64);
  local_38 = &local_58;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 55, std::greater<int>{})",
             "storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x40b,"void lower_bound_sorted_suite::find_odd_first_predicate()",&local_60,&local_38)
  ;
  local_64 = 0x36;
  local_60 = vista::lower_bound_sorted<int*,int,std::greater<int>>(&local_58,local_44,&local_64);
  local_38 = &uStack_54;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 54, std::greater<int>{})",
             "std::next(storage.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x40d,"void lower_bound_sorted_suite::find_odd_first_predicate()",&local_60,&local_38)
  ;
  return;
}

Assistant:

void find_odd_first_predicate()
{
    std::array<int, 5> storage = { 55, 44, 33, 22, 11 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 56, std::greater<int>{}),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 55, std::greater<int>{}),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 54, std::greater<int>{}),
                  std::next(storage.begin(), 1));
}